

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O3

void __thiscall leveldb::Harness_SimpleMulti_Test::TestBody(Harness_SimpleMulti_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  UnitTest *this_00;
  long lVar3;
  Random rnd;
  Random local_84;
  char *local_80;
  size_t sStack_78;
  char local_70 [16];
  string local_60;
  Slice local_40;
  
  paVar1 = &local_60.field_2;
  lVar3 = 0;
  do {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + lVar3));
    this_00 = testing::UnitTest::GetInstance();
    iVar2 = testing::UnitTest::random_seed(this_00);
    local_84.seed_ = iVar2 + 3U & 0x7fffffff;
    if ((local_84.seed_ == 0x7fffffff) || (local_84.seed_ == 0)) {
      local_84.seed_ = 1;
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"abc","");
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"v","");
    local_40.data_ = local_80;
    local_40.size_ = sStack_78;
    Constructor::Add((this->super_Harness).constructor_,&local_60,&local_40);
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"abcd","");
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"v","");
    local_40.data_ = local_80;
    local_40.size_ = sStack_78;
    Constructor::Add((this->super_Harness).constructor_,&local_60,&local_40);
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ac","");
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"v2","");
    local_40.data_ = local_80;
    local_40.size_ = sStack_78;
    Constructor::Add((this->super_Harness).constructor_,&local_60,&local_40);
    if (local_80 != local_70) {
      operator_delete(local_80);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    Harness::Test(&this->super_Harness,&local_84);
    lVar3 = lVar3 + 0xc;
  } while (lVar3 != 0xc0);
  return;
}

Assistant:

TEST_F(Harness, SimpleMulti) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 3);
    Add("abc", "v");
    Add("abcd", "v");
    Add("ac", "v2");
    Test(&rnd);
  }
}